

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

string * __thiscall
soul::HTMLGenerator::run_abi_cxx11_
          (string *__return_storage_ptr__,HTMLGenerator *this,CompileMessageList *errors,
          HTMLGenerationOptions *options)

{
  pointer pFVar1;
  string *psVar2;
  bool bVar3;
  HTMLElement *pHVar4;
  HTMLElement *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_> *__range2;
  File *f;
  pointer library;
  pointer this_01;
  string_view value;
  string_view text;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  allocator<char> local_53a;
  allocator<char> local_539;
  string *local_538;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  HTMLElement content;
  HTMLElement nav;
  string local_360;
  string local_340;
  ostringstream contentText;
  ostringstream navText;
  
  bVar3 = SourceCodeModel::rebuild
                    (&this->model,errors,
                     *(ArrayView<soul::RefCountedPtr<soul::SourceCodeText>_> *)options);
  if (!bVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_538 = __return_storage_ptr__;
  createNav(&nav,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"section",(allocator<char> *)&navText);
  choc::html::HTMLElement::HTMLElement(&content,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  value._M_str = "content";
  value._M_len = 7;
  choc::html::HTMLElement::setID(&content,value);
  pFVar1 = (this->model).files.
           super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (library = (this->model).files.
                 super__Vector_base<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
                 ._M_impl.super__Vector_impl_data._M_start; library != pFVar1; library = library + 1
      ) {
    printLibrary(this,&content,library);
  }
  if ((options->templateContent)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"html",(allocator<char> *)&contentText);
    choc::html::HTMLElement::HTMLElement((HTMLElement *)&navText,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contentText,"lang",(allocator<char> *)&local_530);
    value_00._M_str = "en-US";
    value_00._M_len = 5;
    choc::html::HTMLElement::setProperty((HTMLElement *)&navText,(string *)&contentText,value_00);
    std::__cxx11::string::~string((string *)&contentText);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"head",(allocator<char> *)&contentText);
    pHVar4 = choc::html::HTMLElement::addChild((HTMLElement *)&navText,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"title",(allocator<char> *)&contentText);
    this_00 = choc::html::HTMLElement::addChild(pHVar4,&local_450);
    text._M_str = "SOUL Documentation";
    text._M_len = 0x12;
    choc::html::HTMLElement::addContent(this_00,text);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"link",(allocator<char> *)&local_4f0);
    pHVar4 = choc::html::HTMLElement::addChild(pHVar4,&local_470);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contentText,"rel",(allocator<char> *)&local_510);
    value_01._M_str = "stylesheet";
    value_01._M_len = 10;
    pHVar4 = choc::html::HTMLElement::setProperty(pHVar4,(string *)&contentText,value_01);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"href",(allocator<char> *)&local_4d0);
    value_02._M_str = (options->cssFilename)._M_dataplus._M_p;
    value_02._M_len = (options->cssFilename)._M_string_length;
    choc::html::HTMLElement::setProperty(pHVar4,&local_530,value_02);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&contentText);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"body",(allocator<char> *)&contentText);
    pHVar4 = choc::html::HTMLElement::addChild((HTMLElement *)&navText,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    choc::html::HTMLElement::addChild(pHVar4,&nav);
    choc::html::HTMLElement::addChild(pHVar4,&content);
    choc::html::HTMLElement::toDocument_abi_cxx11_(local_538,(HTMLElement *)&navText,true);
    choc::html::HTMLElement::~HTMLElement((HTMLElement *)&navText);
    goto LAB_001f9e23;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&navText);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&contentText);
  for (; nav.children.
         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         nav.children.
         super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
         _M_impl.super__Vector_impl_data._M_finish;
      nav.children.
      super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
      super__Vector_impl_data._M_start =
           nav.children.
           super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) {
    choc::html::HTMLElement::writeToStream<std::__cxx11::ostringstream>
              (nav.children.
               super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
               ._M_impl.super__Vector_impl_data._M_start,&navText,false);
  }
  for (this_01 = content.children.
                 super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      content.children.
      super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
      super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    choc::html::HTMLElement::writeToStream<std::__cxx11::ostringstream>(this_01,&contentText,false);
  }
  std::__cxx11::string::string((string *)&local_530,(string *)&options->templateContent);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"$NAVIGATION",&local_539);
  std::__cxx11::stringbuf::str();
  bVar3 = replaceTemplatePlaceholder(this,errors,&local_530,&local_4f0,&local_510);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"$CONTENT",&local_53a);
    std::__cxx11::stringbuf::str();
    bVar3 = replaceTemplatePlaceholder(this,errors,&local_530,&local_4d0,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_4f0);
    if (!bVar3) goto LAB_001f9dd0;
    (local_538->_M_dataplus)._M_p = (pointer)&local_538->field_2;
    paVar5 = &local_530.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p == paVar5) {
      (local_538->field_2)._M_allocated_capacity = local_530.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&local_538->field_2 + 8) = local_530.field_2._8_8_;
    }
    else {
      (local_538->_M_dataplus)._M_p = local_530._M_dataplus._M_p;
      (local_538->field_2)._M_allocated_capacity = local_530.field_2._M_allocated_capacity;
    }
    local_538->_M_string_length = local_530._M_string_length;
    local_530._M_dataplus._M_p = (pointer)paVar5;
    psVar2 = &local_530;
  }
  else {
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_4f0);
LAB_001f9dd0:
    paVar5 = &local_538->field_2;
    (local_538->_M_dataplus)._M_p = (pointer)paVar5;
    psVar2 = local_538;
  }
  psVar2->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&contentText);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&navText);
LAB_001f9e23:
  choc::html::HTMLElement::~HTMLElement(&content);
  choc::html::HTMLElement::~HTMLElement(&nav);
  return local_538;
}

Assistant:

std::string run (soul::CompileMessageList& errors,
                     const HTMLGenerationOptions& options)
    {
        if (! model.rebuild (errors, options.sourceFiles))
            return {};

        auto nav = createNav();

        choc::html::HTMLElement content ("section");
        content.setID ("content");

        for (auto& f : model.files)
            printLibrary (content, f);

        if (options.templateContent.empty())
        {
            choc::html::HTMLElement root ("html");
            root.setProperty ("lang", "en-US");

            auto& head = root.addChild ("head");
            head.addChild ("title").addContent ("SOUL Documentation");
            head.addChild ("link").setProperty ("rel", "stylesheet")
                                  .setProperty ("href", options.cssFilename);

            auto& body = root.addChild ("body");
            body.addChild (std::move (nav));
            body.addChild (std::move (content));
            return root.toDocument (true);
        }

        std::ostringstream navText, contentText;

        for (auto& c : nav.getChildren())
            c.writeToStream (navText, false);

        for (auto& c : content.getChildren())
            c.writeToStream (contentText, false);

        auto doc = options.templateContent;

        if (replaceTemplatePlaceholder (errors, doc, "$NAVIGATION", navText.str())
             && replaceTemplatePlaceholder (errors, doc, "$CONTENT", contentText.str()))
        {
            return doc;
        }

        return {};
    }